

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O2

char * sym_decorate(BuildCtx *ctx,char *prefix,char *suffix)

{
  size_t sVar1;
  char *pcVar2;
  char name [256];
  
  pcVar2 = "";
  if (ctx->mode == BUILD_machasm) {
    pcVar2 = "_";
  }
  sprintf(name,"%s%s%s",pcVar2,prefix,suffix);
  pcVar2 = strchr(name,0x40);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  sVar1 = strlen(name);
  pcVar2 = (char *)malloc(sVar1 + 1);
  strcpy(pcVar2,name);
  return pcVar2;
}

Assistant:

static const char *sym_decorate(BuildCtx *ctx,
				const char *prefix, const char *suffix)
{
  char name[256];
  char *p;
#if LJ_64
  const char *symprefix = ctx->mode == BUILD_machasm ? "_" : "";
#elif LJ_TARGET_XBOX360
  const char *symprefix = "";
#else
  const char *symprefix = ctx->mode != BUILD_elfasm ? "_" : "";
#endif
  sprintf(name, "%s%s%s", symprefix, prefix, suffix);
  p = strchr(name, '@');
  if (p) {
#if LJ_TARGET_X86ORX64
    if (!LJ_64 && (ctx->mode == BUILD_coffasm || ctx->mode == BUILD_peobj))
      name[0] = name[1] == 'R' ? '_' : '@';  /* Just for _RtlUnwind@16. */
    else
      *p = '\0';
#elif LJ_TARGET_PPC && !LJ_TARGET_CONSOLE
    /* Keep @plt etc. */
#else
    *p = '\0';
#endif
  }
  p = (char *)malloc(strlen(name)+1);  /* MSVC doesn't like strdup. */
  strcpy(p, name);
  return p;
}